

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

void __thiscall slang::ast::ASTContext::addAssertionBacktrace(ASTContext *this,Diagnostic *diag)

{
  int iVar1;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  bool bVar2;
  Diagnostic *__str;
  ASTContext *in_RSI;
  long in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  Diagnostic *note;
  AssertionInstanceDetails *inst;
  size_t in_stack_ffffffffffffff58;
  Diagnostic *in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff68;
  DiagCode in_stack_ffffffffffffff74;
  Diagnostic *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  Diagnostic *diag_00;
  
  if (*(long *)(in_RDI + 0x30) != 0) {
    diag_00 = *(Diagnostic **)(in_RDI + 0x30);
    bVar2 = SourceLocation::operator_cast_to_bool((SourceLocation *)0x592a52);
    if (bVar2) {
      Diagnostic::addNote(in_stack_ffffffffffffff60,in_stack_ffffffffffffff74,
                          in_stack_ffffffffffffff68);
    }
    else {
      if (*(int *)&(((diag_00->args).
                     super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                   ).
                   super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
          == 0x56) {
        return;
      }
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         ((long)&(((diag_00->args).
                                   super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                 ).
                                 super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                         + 8));
      if (!bVar2) {
        __str = Diagnostic::addNote(in_stack_ffffffffffffff60,in_stack_ffffffffffffff74,
                                    in_stack_ffffffffffffff68);
        iVar1 = *(int *)&(((diag_00->args).
                           super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                         ).
                         super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        ;
        if (iVar1 == 0x4f) {
          bVar3 = sv((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          in_stack_ffffffffffffffb0 = (char *)bVar3._M_len;
          arg._M_str = in_stack_ffffffffffffffb0;
          arg._M_len = (size_t)in_stack_ffffffffffffffa8;
          Diagnostic::operator<<(in_stack_ffffffffffffffa0,arg);
        }
        else if (iVar1 == 0x50) {
          bVar3 = sv((char *)__str,in_stack_ffffffffffffff58);
          in_stack_ffffffffffffffa0 = (Diagnostic *)bVar3._M_len;
          in_stack_ffffffffffffffa8 = bVar3._M_str;
          arg_00._M_str = in_stack_ffffffffffffffb0;
          arg_00._M_len = (size_t)in_stack_ffffffffffffffa8;
          Diagnostic::operator<<(in_stack_ffffffffffffffa0,arg_00);
        }
        else {
          sv((char *)in_stack_ffffffffffffff60,(size_t)__str);
          arg_01._M_str = in_stack_ffffffffffffffb0;
          arg_01._M_len = (size_t)in_stack_ffffffffffffffa8;
          Diagnostic::operator<<(in_stack_ffffffffffffffa0,arg_01);
        }
        arg_02._M_str = in_stack_ffffffffffffffb0;
        arg_02._M_len = (size_t)in_stack_ffffffffffffffa8;
        Diagnostic::operator<<(in_stack_ffffffffffffffa0,arg_02);
      }
    }
    if ((diag_00->args).
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      addAssertionBacktrace(in_RSI,diag_00);
    }
  }
  return;
}

Assistant:

void ASTContext::addAssertionBacktrace(Diagnostic& diag) const {
    if (!assertionInstance)
        return;

    auto& inst = *assertionInstance;
    if (inst.argExpansionLoc) {
        diag.addNote(diag::NoteExpandedHere, inst.argExpansionLoc);
    }
    else {
        // We ignore checkers here; they have specialized handling in Compilation.cpp.
        SLANG_ASSERT(inst.symbol);
        if (inst.symbol->kind == SymbolKind::Checker)
            return;

        if (!inst.symbol->name.empty()) {
            auto& note = diag.addNote(diag::NoteWhileExpanding, inst.instanceLoc);
            switch (inst.symbol->kind) {
                case SymbolKind::Sequence:
                    note << "sequence"sv;
                    break;
                case SymbolKind::Property:
                    note << "property"sv;
                    break;
                case SymbolKind::LetDecl:
                    note << "let declaration"sv;
                    break;
                default:
                    SLANG_UNREACHABLE;
            }
            note << inst.symbol->name;
        }
    }

    if (inst.prevContext)
        inst.prevContext->addAssertionBacktrace(diag);
}